

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

string * Corrade::Utility::Directory::current_abi_cxx11_(void)

{
  bool bVar1;
  String *this;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_30 [8];
  Optional<Corrade::Containers::String> out;
  
  Path::currentDirectory();
  bVar1 = Containers::Optional::operator_cast_to_bool((Optional *)local_30);
  if (bVar1) {
    this = Containers::Optional<Corrade::Containers::String>::operator*
                     ((Optional<Corrade::Containers::String> *)local_30);
    Containers::String::operator_cast_to_string(&local_60,this);
    std::__cxx11::string::string((string *)in_RDI,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  Containers::Optional<Corrade::Containers::String>::~Optional
            ((Optional<Corrade::Containers::String> *)local_30);
  return in_RDI;
}

Assistant:

std::string current() {
    Containers::Optional<Containers::String> out = Path::currentDirectory();
    return out ? std::string{*out} : std::string{};
}